

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool tinyexr::miniz::mz_zip_writer_add_put_buf_callback(void *pBuf,int len,void *pUser)

{
  int iVar1;
  long *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  mz_zip_writer_add_state *pState;
  uint local_4;
  
  iVar1 = (**(code **)(*in_RDX + 0x48))
                    (*(undefined8 *)(*in_RDX + 0x50),in_RDX[1],in_RDI,(long)in_ESI);
  if (iVar1 == in_ESI) {
    in_RDX[1] = (long)in_ESI + in_RDX[1];
    in_RDX[2] = (long)in_ESI + in_RDX[2];
  }
  local_4 = (uint)(iVar1 == in_ESI);
  return local_4;
}

Assistant:

static mz_bool mz_zip_writer_add_put_buf_callback(const void *pBuf, int len,
                                                  void *pUser) {
  mz_zip_writer_add_state *pState = (mz_zip_writer_add_state *)pUser;
  if ((int)pState->m_pZip->m_pWrite(pState->m_pZip->m_pIO_opaque,
                                    pState->m_cur_archive_file_ofs, pBuf,
                                    len) != len)
    return MZ_FALSE;
  pState->m_cur_archive_file_ofs += len;
  pState->m_comp_size += len;
  return MZ_TRUE;
}